

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

size_t drwav__on_read_memory(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  size_t bytesRemaining;
  drwav__memory_stream *memory;
  size_t local_18;
  
  local_18 = in_RDX;
  if ((ulong)(in_RDI[1] - in_RDI[2]) < in_RDX) {
    local_18 = in_RDI[1] - in_RDI[2];
  }
  if (local_18 != 0) {
    memcpy(in_RSI,(void *)(*in_RDI + in_RDI[2]),local_18);
    in_RDI[2] = local_18 + in_RDI[2];
  }
  return local_18;
}

Assistant:

static size_t drwav__on_read_memory(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    drwav__memory_stream* memory = (drwav__memory_stream*)pUserData;
    drwav_assert(memory != NULL);
    drwav_assert(memory->dataSize >= memory->currentReadPos);

    size_t bytesRemaining = memory->dataSize - memory->currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }

    if (bytesToRead > 0) {
        DRWAV_COPY_MEMORY(pBufferOut, memory->data + memory->currentReadPos, bytesToRead);
        memory->currentReadPos += bytesToRead;
    }

    return bytesToRead;
}